

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O2

int __thiscall
ON_Matrix::RowReduce(ON_Matrix *this,double zero_tolerance,double *determinant,double *pivot)

{
  double **ppdVar1;
  double dVar2;
  uint uVar3;
  double ***pppdVar4;
  double *pdVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double local_78;
  
  uVar3 = this->m_row_count;
  pppdVar4 = &this->m;
  if (uVar3 == (this->m_rowmem).m_count) {
    pppdVar4 = &(this->m_rowmem).m_a;
  }
  uVar9 = this->m_col_count;
  if ((int)uVar3 < this->m_col_count) {
    uVar9 = uVar3;
  }
  uVar6 = (ulong)uVar9;
  if ((int)uVar9 < 1) {
    uVar6 = 0;
  }
  ppdVar1 = *pppdVar4;
  dVar12 = 1.0;
  uVar11 = 1;
  local_78 = 1.0;
  uVar8 = 0;
  do {
    if (uVar8 == uVar6) {
LAB_0050a83b:
      *pivot = dVar12;
      *determinant = local_78;
      return (int)uVar6;
    }
    pdVar5 = ppdVar1[uVar8];
    dVar14 = pdVar5[uVar8];
    dVar13 = ABS(dVar14);
    uVar10 = uVar8 & 0xffffffff;
    for (uVar7 = uVar11; (int)uVar7 < (int)uVar3; uVar7 = uVar7 + 1) {
      if (dVar13 < ABS(ppdVar1[uVar7][uVar8])) {
        uVar10 = uVar7 & 0xffffffff;
        dVar13 = ABS(ppdVar1[uVar7][uVar8]);
      }
    }
    dVar2 = dVar13;
    if ((uVar8 != 0) && (dVar12 <= dVar13)) {
      dVar2 = dVar12;
    }
    dVar12 = dVar2;
    if (dVar13 <= zero_tolerance) {
      local_78 = 0.0;
      uVar6 = uVar8;
      goto LAB_0050a83b;
    }
    if (uVar8 != uVar10) {
      SwapRows(this,(int)uVar10,(uint)uVar8);
      local_78 = -local_78;
      pdVar5 = ppdVar1[uVar8];
      dVar14 = pdVar5[uVar8];
    }
    uVar10 = uVar8 + 1;
    pdVar5[uVar8] = 1.0;
    uVar9 = ~(uint)uVar8;
    ON_ArrayScale(this->m_col_count + uVar9,1.0 / dVar14,pdVar5 + uVar10,pdVar5 + uVar10);
    for (uVar7 = uVar11; uVar3 = this->m_row_count, (int)uVar7 < (int)uVar3; uVar7 = uVar7 + 1) {
      pdVar5 = ppdVar1[uVar7];
      dVar13 = pdVar5[uVar8];
      pdVar5[uVar8] = 0.0;
      if (zero_tolerance < ABS(dVar13)) {
        ON_Array_aA_plus_B(this->m_col_count + uVar9,-dVar13,ppdVar1[uVar8] + uVar10,pdVar5 + uVar10
                           ,pdVar5 + uVar10);
      }
    }
    local_78 = local_78 * dVar14;
    uVar11 = uVar11 + 1;
    uVar8 = uVar10;
  } while( true );
}

Assistant:

int
ON_Matrix::RowReduce( 
    double zero_tolerance,
    double& determinant,
    double& pivot 
    )
{
  double x, piv, det;
  int i, k, ix, rank;

  double** this_m = ThisM();
  piv = det = 1.0;
  rank = 0;
  const int n = m_row_count <= m_col_count ? m_row_count : m_col_count;
  for ( k = 0; k < n; k++ ) {
    ix = k;
    x = fabs(this_m[ix][k]);
    for ( i = k+1; i < m_row_count; i++ ) {
      if ( fabs(this_m[i][k]) > x ) {
        ix = i;
        x = fabs(this_m[ix][k]);
      }
    }
    if ( x < piv || k == 0 ) {
      piv = x;
    }
    if ( x <= zero_tolerance ) {
      det = 0.0;
      break;
    }
    rank++;

    if ( ix != k )
    {
      // swap rows
      SwapRows( ix, k );
      det = -det;
    }

    // scale row k of matrix and B
    det *= this_m[k][k];
    x = 1.0/this_m[k][k];
    this_m[k][k] = 1.0;
    ON_ArrayScale( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[k][k+1] );

    // zero column k for rows below this_m[k][k]
    for ( i = k+1; i < m_row_count; i++ ) {
      x = -this_m[i][k];
      this_m[i][k] = 0.0;
      if ( fabs(x) > zero_tolerance ) {
        ON_Array_aA_plus_B( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[i][k+1], &this_m[i][k+1] );
      }
    }
  }

  pivot = piv;
  determinant = det;

  return rank;
}